

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::SubdivMeshNode::SubdivMeshNode
          (SubdivMeshNode *this,Ref<embree::SceneGraph::MaterialNode> *material,BBox1f time_range,
          size_t numTimeSteps)

{
  ulong in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  size_t i;
  size_t i_2;
  size_t i_1;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  Node *in_stack_fffffffffffffe90;
  SubdivMeshNode *this_00;
  undefined1 local_d8 [8];
  ulong local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  ulong local_b8;
  ulong local_a0;
  undefined8 local_88;
  undefined1 *local_80;
  undefined1 *local_70;
  long *local_58;
  ulong local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined1 *local_20;
  
  local_88 = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_a0 = in_RDX;
  Node::Node(in_stack_fffffffffffffe90,(bool)in_stack_fffffffffffffe8f);
  *in_RDI = &PTR__SubdivMeshNode_005ff4d8;
  in_RDI[0xd] = local_88;
  this_00 = (SubdivMeshNode *)(in_RDI + 0xe);
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::vector((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            *)0x1a3ada);
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::vector((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            *)0x1a3af3);
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::vector
            ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)0x1a3b0c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1a3b25);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1a3b3e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1a3b57);
  *(undefined4 *)(in_RDI + 0x20) = 1;
  *(undefined4 *)((long)in_RDI + 0x104) = 1;
  *(undefined4 *)(in_RDI + 0x21) = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1a3b8e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1a3ba7);
  std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::vector
            ((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)0x1a3bc0);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x1a3bd9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1a3bf2);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x1a3c0b);
  local_58 = in_RDI + 0x34;
  *local_58 = *in_RSI;
  if (*local_58 != 0) {
    (**(code **)(*(long *)*local_58 + 0x10))();
  }
  *(undefined4 *)(in_RDI + 0x35) = 0x40000000;
  for (local_b8 = 0; local_b8 < local_a0; local_b8 = local_b8 + 1) {
    local_80 = local_d8;
    local_d0 = 0;
    local_c8 = 0;
    local_c0 = 0;
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 *)in_stack_fffffffffffffe90,
                (value_type *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    local_70 = local_d8;
    for (local_40 = 0; local_40 < local_d0; local_40 = local_40 + 1) {
    }
    local_30 = local_c8;
    local_28 = local_c0;
    local_38 = local_70;
    local_20 = local_70;
    alignedFree((void *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    local_c0 = 0;
    local_c8 = 0;
    local_d0 = 0;
  }
  zero_pad_arrays(this_00);
  return;
}

Assistant:

SubdivMeshNode (Ref<MaterialNode> material, const BBox1f time_range = BBox1f(0,1), size_t numTimeSteps = 0) 
        : Node(true),
          time_range(time_range),
          position_subdiv_mode(RTC_SUBDIVISION_MODE_SMOOTH_BOUNDARY), 
          normal_subdiv_mode(RTC_SUBDIVISION_MODE_SMOOTH_BOUNDARY),
          texcoord_subdiv_mode(RTC_SUBDIVISION_MODE_SMOOTH_BOUNDARY),
          material(material), tessellationRate(2.0f) 
      {
        for (size_t i=0; i<numTimeSteps; i++)
          positions.push_back(avector<Vertex>());
        zero_pad_arrays();
      }